

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O2

void __thiscall SQCompilation::DeclGroup::addDeclaration(DeclGroup *this,VarDecl *d)

{
  Decl *pDVar1;
  int iVar2;
  VarDecl *local_18;
  
  local_18 = d;
  ArenaVector<SQCompilation::VarDecl_*>::push_back(&this->_decls,&local_18);
  pDVar1 = &(local_18->super_ValueDecl).super_Decl;
  iVar2 = (pDVar1->super_Statement).super_Node._coordinates.columnEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.lineEnd =
       (pDVar1->super_Statement).super_Node._coordinates.lineEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.columnEnd = iVar2;
  return;
}

Assistant:

void addDeclaration(VarDecl *d) {
      _decls.push_back(d);
      setLineEndPos(d->lineEnd());
      setColumnEndPos(d->columnEnd());
    }